

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::InitBuild
          (RTCPCompoundPacketBuilder *this,void *externalbuffer,size_t buffersize)

{
  size_t buffersize_local;
  void *externalbuffer_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    if ((this->super_RTCPCompoundPacket).compoundpacket == (uint8_t *)0x0) {
      if (buffersize < 600) {
        this_local._4_4_ = -0x23;
      }
      else {
        this->maximumpacketsize = buffersize;
        this->buffer = (uint8_t *)externalbuffer;
        this->external = true;
        this->byesize = 0;
        this->appsize = 0;
        this->arebuilding = true;
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = -0x20;
    }
  }
  else {
    this_local._4_4_ = -0x1f;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::InitBuild(void *externalbuffer,size_t buffersize)
{
	if (arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYBUILDING;
	if (compoundpacket)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYBUILT;

	if (buffersize < RTP_MINPACKETSIZE)
		return ERR_RTP_RTCPCOMPPACKBUILDER_BUFFERSIZETOOSMALL;

	maximumpacketsize = buffersize;
	buffer = (uint8_t *)externalbuffer;
	external = true;
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	arebuilding = true;
	return 0;
}